

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

undefined8
StringBuilder<char[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&>
          (char (*arg) [2],char *args,char (*args_1) [2],unsigned_long *args_2,char (*args_3) [2],
          char *args_4,char (*args_5) [2],unsigned_long *args_6,char (*args_7) [2],char *args_8,
          char (*args_9) [2],unsigned_long *args_10,char (*args_11) [2],char *args_12)

{
  undefined8 in_RDI;
  char *in_R9;
  char (*unaff_R12) [2];
  unsigned_long *unaff_R13;
  char (*unaff_R14) [2];
  char *unaff_R15;
  char (*unaff_retaddr) [2];
  unsigned_long *in_stack_00000008;
  char (*in_stack_00000010) [2];
  char *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000048;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  string local_98 [32];
  char *in_stack_ffffffffffffff88;
  char (*in_stack_ffffffffffffff90) [2];
  unsigned_long *in_stack_ffffffffffffff98;
  char (*in_stack_ffffffffffffffa0) [2];
  
  StringBuilder_abi_cxx11_(in_stack_ffffffffffffff28);
  StringBuilder<char,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&>
            (in_R9,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,unaff_R12,unaff_R13,unaff_R14,unaff_R15,unaff_retaddr,
             in_stack_00000008,in_stack_00000010,in_stack_00000018);
  std::operator+(in_stack_ffffffffffffff38,in_stack_00000048);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}